

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

int __thiscall
TPZSkylMatrix<std::complex<float>_>::Subst_Forward
          (TPZSkylMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *B)

{
  long lVar1;
  float fVar2;
  float fVar3;
  complex<float> **ppcVar4;
  complex<float> *pcVar5;
  int iVar6;
  undefined4 extraout_var;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined8 *puVar10;
  long lVar11;
  complex<float> *pcVar12;
  undefined8 uVar13;
  _ComplexT _Var14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  long local_68;
  long local_60;
  undefined4 extraout_var_00;
  
  lVar7 = (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  iVar6 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  if ((lVar7 != CONCAT44(extraout_var,iVar6)) ||
     ((this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed != '\x03')) {
    TPZMatrix<std::complex<float>_>::Error
              ("virtual int TPZSkylMatrix<std::complex<float>>::Subst_Forward(TPZFMatrix<TVar> *) const [TVar = std::complex<float>]"
               ,"TPZSkylMatrix::Subst_Forward not decomposed with cholesky");
  }
  iVar6 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(this);
  lVar7 = CONCAT44(extraout_var_00,iVar6);
  if (0 < (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol) {
    local_60 = 0;
    local_68 = 0;
    do {
      if (lVar7 < 1) {
        lVar9 = 0;
LAB_00cb7fed:
        if (lVar9 < lVar7) {
          lVar11 = lVar9 * 8 + -8;
          do {
            ppcVar4 = (this->fElem).fStore;
            pcVar5 = ppcVar4[lVar9 + 1];
            lVar8 = (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
            if ((lVar8 <= lVar9) ||
               ((B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= local_68)) {
              TPZFMatrix<std::complex<float>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pcVar12 = ppcVar4[lVar9] + 1;
            fVar18 = 0.0;
            fVar19 = 0.0;
            if (pcVar12 < pcVar5) {
              puVar10 = (undefined8 *)((long)&B->fElem->_M_value + lVar8 * local_60 + lVar11);
              do {
                fVar2 = *(float *)&pcVar12->_M_value;
                fVar3 = *(float *)((long)&pcVar12->_M_value + 4);
                uVar13 = *puVar10;
                fVar15 = (float)((ulong)uVar13 >> 0x20);
                fVar17 = fVar2 * (float)uVar13 + fVar15 * fVar3;
                fVar16 = fVar2 * fVar15 - (float)uVar13 * fVar3;
                if ((NAN(fVar17)) && (NAN(fVar16))) {
                  uVar13 = __mulsc3(fVar2,-fVar3,uVar13,fVar15);
                  fVar17 = (float)uVar13;
                  fVar16 = (float)((ulong)uVar13 >> 0x20);
                }
                fVar18 = fVar18 + fVar17;
                fVar19 = fVar19 + fVar16;
                pcVar12 = pcVar12 + 1;
                puVar10 = puVar10 + -1;
              } while (pcVar12 < pcVar5);
              lVar8 = (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
            }
            if ((lVar8 <= lVar9) ||
               ((B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= local_68)) {
              TPZFMatrix<std::complex<float>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar1 = lVar9 + 1;
            lVar8 = lVar8 * local_68;
            pcVar5 = B->fElem;
            fVar19 = (float)(pcVar5[lVar8 + lVar9]._M_value >> 0x20) - fVar19;
            _Var14 = CONCAT44(fVar19,(float)pcVar5[lVar8 + lVar9]._M_value - fVar18);
            pcVar5[lVar8 + lVar9]._M_value = _Var14;
            pcVar12 = (this->fElem).fStore[lVar9];
            _Var14 = __divsc3(_Var14,fVar19,(int)pcVar12->_M_value,
                              *(undefined4 *)((long)&pcVar12->_M_value + 4));
            pcVar5[lVar8 + lVar9]._M_value = _Var14;
            lVar11 = lVar11 + 8;
            lVar9 = lVar1;
          } while (lVar1 != lVar7);
        }
      }
      else {
        lVar11 = (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
        lVar9 = 0;
        do {
          if ((lVar11 <= lVar9) ||
             ((B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= local_68)) {
            TPZFMatrix<std::complex<float>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar8 = local_60 * lVar11;
          fVar19 = *(float *)((long)&B->fElem[lVar9]._M_value + lVar8);
          if ((((fVar19 != 0.0) || (NAN(fVar19))) ||
              (fVar19 = *(float *)((long)&B->fElem[lVar9]._M_value + lVar8 + 4), fVar19 != 0.0)) ||
             (NAN(fVar19))) goto LAB_00cb7fed;
          lVar9 = lVar9 + 1;
        } while (lVar7 != lVar9);
      }
      local_68 = local_68 + 1;
      local_60 = local_60 + 8;
    } while (local_68 < (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol);
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const
{
    if ( (B->Rows() != this->Dim()) || this->fDecomposed != ECholesky)
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZSkylMatrix::Subst_Forward not decomposed with cholesky");
    
#ifdef DUMP_BEFORE_SUBST
    dump_matrices(this, B, "TPZSkylMatrix::Subst_Forward(B)");
#endif
    
    //	std::cout << "SubstForward this " << (void *) this << " neq " << Dim() << " normb " << Norm(*B) << std::endl;
    int64_t dimension=this->Dim();
    for ( int64_t j = 0; j < B->Cols(); j++ )
    {
        int64_t k=0;
        while (k<dimension && (*B)(k,j) == TVar(0)) {
            k++;
        }
        //		std::cout << "kstart " << k << std::endl;
        for (; k < dimension; k++ )
        {
            // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
            //
            TVar sum = 0.0;
            TVar *elem_ki = fElem[k]+1;
            TVar *end_ki  = fElem[k+1];
            TVar* BPtr = &(*B)(k,j);   //(k-1,j)
            //	for ( int i = k-1; elem_ki < end_ki; i-- )
            //	  sum += (*elem_ki++) * B->GetVal( i, j );
            
            //EBORIN:
            // Is this a hot-spot?
            // Is it vectorized?
            if constexpr(is_complex<TVar>::value)
                while(elem_ki < end_ki) sum += std::conj(*elem_ki++) * (*--BPtr);//(*BPtr--)
            else
                while(elem_ki < end_ki) sum += (*elem_ki++) * (*--BPtr);//(*BPtr--)
            // Faz B[k,j] = (B[k,j] - sum) / A[k,k].
            //
            //	B->PutVal( k, j, (B->GetVal(k, j) - sum) / row_k->pElem[0] );
            BPtr = &(*B)(k,j);
            *BPtr-= sum;
            *BPtr /= fElem[k][0];
        }
    }
    
    return( 1 );
}